

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseLimits(WastParser *this,Limits *out_limits)

{
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  Enum EVar4;
  
  RVar2 = ParseNat(this,&out_limits->initial);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = false;
    TVar3 = Peek(this,0);
    if (TVar3 == Last_Literal) {
      RVar2 = ParseNat(this,&out_limits->max);
      bVar1 = true;
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
    }
    out_limits->has_max = bVar1;
    bVar1 = Match(this,Shared);
    if (bVar1) {
      out_limits->is_shared = true;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseLimits(Limits* out_limits) {
  WABT_TRACE(ParseLimits);

  CHECK_RESULT(ParseNat(&out_limits->initial));
  if (PeekMatch(TokenType::Nat)) {
    CHECK_RESULT(ParseNat(&out_limits->max));
    out_limits->has_max = true;
  } else {
    out_limits->has_max = false;
  }

  if (Match(TokenType::Shared)) {
    out_limits->is_shared = true;
  }

  return Result::Ok;
}